

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  uVar1 = pMem1->flags;
  uVar2 = pMem2->flags;
  uVar6 = uVar2 | uVar1;
  if ((uVar6 & 1) != 0) {
    return (uVar2 & 1) - (uVar1 & 1);
  }
  if ((uVar6 & 0x2c) == 0) {
    if ((uVar6 & 2) == 0) {
      iVar9 = pMem1->n;
      iVar7 = pMem2->n;
      uVar1 = pMem1->flags;
      if (((pMem2->flags | uVar1) >> 10 & 1) == 0) {
        iVar8 = iVar7;
        if (iVar9 < iVar7) {
          iVar8 = iVar9;
        }
        iVar8 = memcmp(pMem1->z,pMem2->z,(long)iVar8);
        if (iVar8 != 0) {
          return iVar8;
        }
        return iVar9 - iVar7;
      }
      if ((uVar1 & 0x400 & pMem2->flags) == 0) {
        if ((uVar1 & 0x400) != 0) {
          iVar9 = isAllZero(pMem2->z,iVar7);
          if (iVar9 != 0) {
            return (pMem1->u).nZero - iVar7;
          }
          return -1;
        }
        iVar7 = isAllZero(pMem1->z,iVar9);
        if (iVar7 == 0) {
          return 1;
        }
      }
      else {
        iVar9 = (pMem1->u).nZero;
      }
      return iVar9 - (pMem2->u).nZero;
    }
    if ((uVar1 & 2) == 0) {
      return 1;
    }
    if ((uVar2 & 2) != 0) {
      if (pColl == (CollSeq *)0x0) {
        iVar7 = sqlite3BlobCompare(pMem1,pMem2);
        return iVar7;
      }
      iVar7 = vdbeCompareMemString(pMem1,pMem2,pColl,(u8 *)0x0);
      return iVar7;
    }
  }
  else if ((uVar2 & uVar1 & 0x24) == 0) {
    if ((uVar2 & uVar1 & 8) == 0) {
      if ((uVar1 & 0x24) != 0) {
        if ((uVar2 & 8) != 0) {
          iVar7 = sqlite3IntFloatCompare((pMem1->u).i,(pMem2->u).r);
          return iVar7;
        }
        if ((uVar2 & 0x24) == 0) {
          return -1;
        }
        lVar3 = (pMem2->u).i;
        lVar4 = (pMem1->u).i;
        bVar11 = SBORROW8(lVar4,lVar3);
        lVar5 = lVar4 - lVar3;
        bVar10 = lVar4 == lVar3;
        if (lVar4 < lVar3) {
          return -1;
        }
        goto LAB_0014841d;
      }
      if ((uVar1 & 8) == 0) {
        return 1;
      }
      if ((uVar2 & 0x24) != 0) {
        iVar7 = sqlite3IntFloatCompare((pMem2->u).i,(pMem1->u).r);
        return -iVar7;
      }
    }
    else if ((pMem2->u).r <= (pMem1->u).r) {
      return (int)((pMem2->u).r < (pMem1->u).r);
    }
  }
  else {
    lVar3 = (pMem2->u).i;
    lVar4 = (pMem1->u).i;
    bVar11 = SBORROW8(lVar4,lVar3);
    lVar5 = lVar4 - lVar3;
    bVar10 = lVar4 == lVar3;
    if (lVar3 <= lVar4) {
LAB_0014841d:
      return (int)(!bVar10 && bVar11 == lVar5 < 0);
    }
  }
  return -1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( !sqlite3VdbeMemIsRowSet(pMem1) && !sqlite3VdbeMemIsRowSet(pMem2) );

  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* At least one of the two values is a number
  */
  if( combined_flags&(MEM_Int|MEM_Real|MEM_IntReal) ){
    testcase( combined_flags & MEM_Int );
    testcase( combined_flags & MEM_Real );
    testcase( combined_flags & MEM_IntReal );
    if( (f1 & f2 & (MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & f2 & MEM_Int );
      testcase( f1 & f2 & MEM_IntReal );
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return +1;
      return 0;
    }
    if( (f1 & f2 & MEM_Real)!=0 ){
      if( pMem1->u.r < pMem2->u.r ) return -1;
      if( pMem1->u.r > pMem2->u.r ) return +1;
      return 0;
    }
    if( (f1&(MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & MEM_Int );
      testcase( f1 & MEM_IntReal );
      if( (f2&MEM_Real)!=0 ){
        return sqlite3IntFloatCompare(pMem1->u.i, pMem2->u.r);
      }else if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        if( pMem1->u.i < pMem2->u.i ) return -1;
        if( pMem1->u.i > pMem2->u.i ) return +1;
        return 0;
      }else{
        return -1;
      }
    }
    if( (f1&MEM_Real)!=0 ){
      if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        testcase( f2 & MEM_Int );
        testcase( f2 & MEM_IntReal );
        return -sqlite3IntFloatCompare(pMem2->u.i, pMem1->u.r);
      }else{
        return -1;
      }
    }
    return +1;
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc || pMem1->db->mallocFailed );
    assert( pMem1->enc==SQLITE_UTF8 ||
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      return vdbeCompareMemString(pMem1, pMem2, pColl, 0);
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }

  /* Both values must be blobs.  Compare using memcmp().  */
  return sqlite3BlobCompare(pMem1, pMem2);
}